

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll.c
# Opt level: O0

int poll_del(event_base *base,int fd,short old,short events,void *idx_)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  long lVar4;
  int *piVar5;
  int i;
  pollidx *idx;
  pollfd *pfd;
  pollop *pop;
  void *idx__local;
  short events_local;
  short old_local;
  int fd_local;
  event_base *base_local;
  
  pvVar2 = base->evbase;
  if ((events & 8U) != 0) {
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/poll.c"
               ,0x11d,"(events & EV_SIGNAL) == 0","poll_del");
  }
  if ((events & 6U) == 0) {
    base_local._4_4_ = 0;
  }
  else {
    iVar1 = *idx_;
    iVar3 = iVar1 + -1;
    if (iVar3 < 0) {
      base_local._4_4_ = -1;
    }
    else {
      lVar4 = *(long *)((long)pvVar2 + 0x10) + (long)iVar3 * 8;
      if ((events & 2U) != 0) {
        *(ushort *)(lVar4 + 4) = *(ushort *)(lVar4 + 4) & 0xfffe;
      }
      if ((events & 4U) != 0) {
        *(ushort *)(lVar4 + 4) = *(ushort *)(lVar4 + 4) & 0xfffb;
      }
      if (*(short *)(lVar4 + 4) == 0) {
        *(undefined4 *)idx_ = 0;
        *(int *)((long)pvVar2 + 4) = *(int *)((long)pvVar2 + 4) + -1;
        if (iVar3 != *(int *)((long)pvVar2 + 4)) {
          *(undefined8 *)(*(long *)((long)pvVar2 + 0x10) + (long)iVar3 * 8) =
               *(undefined8 *)
                (*(long *)((long)pvVar2 + 0x10) + (long)*(int *)((long)pvVar2 + 4) * 8);
          piVar5 = (int *)evmap_io_get_fdinfo_
                                    (&base->io,
                                     *(int *)(*(long *)((long)pvVar2 + 0x10) + (long)iVar3 * 8));
          if (piVar5 == (int *)0x0) {
            event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/poll.c"
                       ,0x13d,"idx","poll_del");
          }
          if (*piVar5 != *(int *)((long)pvVar2 + 4) + 1) {
            event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/poll.c"
                       ,0x13e,"idx->idxplus1 == pop->nfds + 1","poll_del");
          }
          *piVar5 = iVar1;
        }
        base_local._4_4_ = 0;
      }
      else {
        base_local._4_4_ = 0;
      }
    }
  }
  return base_local._4_4_;
}

Assistant:

static int
poll_del(struct event_base *base, int fd, short old, short events, void *idx_)
{
	struct pollop *pop = base->evbase;
	struct pollfd *pfd = NULL;
	struct pollidx *idx = idx_;
	int i;

	EVUTIL_ASSERT((events & EV_SIGNAL) == 0);
	if (!(events & (EV_READ|EV_WRITE)))
		return (0);

	poll_check_ok(pop);
	i = idx->idxplus1 - 1;
	if (i < 0)
		return (-1);

	/* Do we still want to read or write? */
	pfd = &pop->event_set[i];
	if (events & EV_READ)
		pfd->events &= ~POLLIN;
	if (events & EV_WRITE)
		pfd->events &= ~POLLOUT;
	poll_check_ok(pop);
	if (pfd->events)
		/* Another event cares about that fd. */
		return (0);

	/* Okay, so we aren't interested in that fd anymore. */
	idx->idxplus1 = 0;

	--pop->nfds;
	if (i != pop->nfds) {
		/*
		 * Shift the last pollfd down into the now-unoccupied
		 * position.
		 */
		memcpy(&pop->event_set[i], &pop->event_set[pop->nfds],
		       sizeof(struct pollfd));
		idx = evmap_io_get_fdinfo_(&base->io, pop->event_set[i].fd);
		EVUTIL_ASSERT(idx);
		EVUTIL_ASSERT(idx->idxplus1 == pop->nfds + 1);
		idx->idxplus1 = i + 1;
	}

	poll_check_ok(pop);
	return (0);
}